

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedStepIntegrator.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::integrators::FixedStepIntegrator::integrate
          (FixedStepIntegrator *this,double initialTime,double finalTime)

{
  vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
  *this_00;
  DynamicalSystem *this_01;
  pointer pSVar1;
  int iVar2;
  int iVar3;
  string *psVar4;
  size_t sVar5;
  ulong uVar6;
  undefined4 extraout_var;
  ostream *poVar7;
  char *pcVar8;
  pointer pcVar9;
  int iVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  ostringstream errorMsg;
  long *local_1d0;
  long local_1c0 [2];
  double local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  this_01 = (this->super_Integrator).m_dynamicalSystem_ptr.
            super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if (this_01 == (DynamicalSystem *)0x0) {
    psVar4 = IntegratorInfo::name_abi_cxx11_(&(this->super_Integrator).m_info);
    pcVar9 = (psVar4->_M_dataplus)._M_p;
    pcVar8 = "No dynamical system have been set yet.";
  }
  else {
    dVar13 = finalTime - initialTime;
    if (dVar13 < 0.0) {
      psVar4 = IntegratorInfo::name_abi_cxx11_(&(this->super_Integrator).m_info);
      pcVar9 = (psVar4->_M_dataplus)._M_p;
      pcVar8 = "The final time is supposed to be greater than the initial time.";
    }
    else if ((this->super_Integrator).m_dTmax <= 0.0) {
      psVar4 = IntegratorInfo::name_abi_cxx11_(&(this->super_Integrator).m_info);
      pcVar9 = (psVar4->_M_dataplus)._M_p;
      pcVar8 = "The maximum dT should be greater than zero.";
    }
    else {
      sVar5 = DynamicalSystem::stateSpaceSize(this_01);
      dVar12 = ceil(dVar13 / (this->super_Integrator).m_dTmax);
      iVar10 = (int)dVar12;
      this_00 = &(this->super_Integrator).m_solution;
      std::
      vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
      ::resize(this_00,(long)(iVar10 + 1));
      (*((this->super_Integrator).m_dynamicalSystem_ptr.
         super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->_vptr_DynamicalSystem[6])();
      uVar6 = iDynTree::VectorDynSize::size();
      if (uVar6 == (sVar5 & 0xffffffff)) {
        iDynTree::VectorDynSize::resize
                  ((ulong)(this->super_Integrator).m_solution.
                          super__Vector_base<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        iVar2 = (*((this->super_Integrator).m_dynamicalSystem_ptr.
                   super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_vptr_DynamicalSystem[6])();
        iDynTree::VectorDynSize::operator=
                  (&((this->super_Integrator).m_solution.
                     super__Vector_base<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                     ._M_impl.super__Vector_impl_data._M_start)->stateAtT,
                   (VectorDynSize *)CONCAT44(extraout_var,iVar2));
        ((this->super_Integrator).m_solution.
         super__Vector_base<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
         ._M_impl.super__Vector_impl_data._M_start)->time = initialTime;
        if (iVar10 < 1) {
          dVar13 = 0.0;
        }
        else {
          dVar13 = dVar13 / (double)iVar10;
        }
        if (1 < iVar10) {
          lVar11 = 0;
          iVar2 = 0;
          do {
            local_1b0 = (double)iVar2 * dVar13 + initialTime;
            pSVar1 = (this->super_Integrator).m_solution.
                     super__Vector_base<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar3 = (*(this->super_Integrator)._vptr_Integrator[0x10])
                              (this,&pSVar1->stateAtT + lVar11,&pSVar1[1].stateAtT + lVar11);
            if ((char)iVar3 == '\0') {
              std::__cxx11::ostringstream::ostringstream(local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Error at time ",0xe);
              poVar7 = std::ostream::_M_insert<double>(local_1b0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,".",1);
              psVar4 = IntegratorInfo::name_abi_cxx11_(&(this->super_Integrator).m_info);
              pcVar8 = (psVar4->_M_dataplus)._M_p;
              std::__cxx11::stringbuf::str();
              iDynTree::reportError(pcVar8,"integrate",(char *)local_1d0);
              goto LAB_0017097e;
            }
            iVar2 = iVar2 + 1;
            *(double *)
             ((long)&(this_00->
                     super__Vector_base<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                     )._M_impl.super__Vector_impl_data._M_start[1].time + lVar11) =
                 (double)iVar2 * dVar13 + initialTime;
            lVar11 = lVar11 + 0x28;
          } while ((ulong)(iVar10 - 1U) * 0x28 != lVar11);
        }
        pSVar1 = (this->super_Integrator).m_solution.
                 super__Vector_base<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                 ._M_impl.super__Vector_impl_data._M_start + (int)(iVar10 - 1U);
        dVar13 = pSVar1->time;
        iVar10 = (*(this->super_Integrator)._vptr_Integrator[0x10])
                           (dVar13,finalTime - dVar13,this,pSVar1,
                            (this->super_Integrator).m_solution.
                            super__Vector_base<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -1);
        if ((char)iVar10 != '\0') {
          (this->super_Integrator).m_solution.
          super__Vector_base<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].time = finalTime;
          return true;
        }
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error in last iteration",0x17);
        psVar4 = IntegratorInfo::name_abi_cxx11_(&(this->super_Integrator).m_info);
        pcVar8 = (psVar4->_M_dataplus)._M_p;
        std::__cxx11::stringbuf::str();
        iDynTree::reportError(pcVar8,"integrate",(char *)local_1d0);
LAB_0017097e:
        if (local_1d0 != local_1c0) {
          operator_delete(local_1d0,local_1c0[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
        return false;
      }
      psVar4 = IntegratorInfo::name_abi_cxx11_(&(this->super_Integrator).m_info);
      pcVar9 = (psVar4->_M_dataplus)._M_p;
      pcVar8 = "The initial state has a wrong dimension.";
    }
  }
  iDynTree::reportError(pcVar9,"integrate",pcVar8);
  return false;
}

Assistant:

bool FixedStepIntegrator::integrate(double initialTime, double finalTime){

                if (!m_dynamicalSystem_ptr){
                    reportError(m_info.name().c_str(), "integrate", "No dynamical system have been set yet.");
                    return false;
                }

                if ((finalTime - initialTime) < 0){
                    reportError(m_info.name().c_str(), "integrate", "The final time is supposed to be greater than the initial time.");
                    return false;
                }
                if (m_dTmax <= 0){
                    reportError(m_info.name().c_str(), "integrate", "The maximum dT should be greater than zero.");
                    return false;
                }

                unsigned int stateDim = static_cast<unsigned int>(m_dynamicalSystem_ptr->stateSpaceSize());

                int iterations = std::ceil((finalTime - initialTime)/m_dTmax);

                m_solution.resize(iterations+1);

                if(m_dynamicalSystem_ptr->initialState().size() != stateDim){
                    reportError(m_info.name().c_str(), "integrate", "The initial state has a wrong dimension.");
                    return false;
                }

                m_solution[0].stateAtT.resize(stateDim);
                m_solution[0].stateAtT = m_dynamicalSystem_ptr->initialState();
                m_solution[0].time = initialTime;

                double dT = 0;
                if (iterations > 0){
                    dT = (finalTime - initialTime)/iterations;
                }

                for(int i = 0; i < (iterations - 1); ++i){
                    if (!oneStepIntegration(initialTime + dT*i, dT, m_solution[i].stateAtT, m_solution[i+1].stateAtT)){
                        std::ostringstream errorMsg;
                        errorMsg << "Error at time " << initialTime + dT*i << ".";
                        reportError(m_info.name().c_str(), "integrate", errorMsg.str().c_str());
                        return false;
                    }
                    m_solution[i+1].time = initialTime + dT*(i+1);
                }
                //Consider last step separately to be sure that the last solution point is in finalTime
                dT = finalTime - m_solution[iterations - 1].time;
                if (!oneStepIntegration(m_solution[iterations - 1].time, dT, m_solution[iterations - 1].stateAtT, m_solution.back().stateAtT)){
                    std::ostringstream errorMsg;
                    errorMsg << "Error in last iteration";
                    reportError(m_info.name().c_str(), "integrate", errorMsg.str().c_str());
                    return false;
                }
                m_solution.back().time = finalTime;

                return true;
            }